

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall FfsParser::parsePeImageSectionBody(FfsParser *this,UModelIndex *index)

{
  short sVar1;
  _Alloc_hider _Var2;
  int *piVar3;
  CBString info;
  UByteArray body;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  CBString local_108;
  CBString local_f0;
  UByteArray local_d8;
  CBString local_b8;
  CBString local_a0;
  CBString local_88;
  CBString local_70;
  CBString local_58;
  CBString local_40;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  TreeModel::body(&local_d8,this->model,index);
  if (((uint)local_d8.d._M_string_length & 0xffffffc0) == 0) {
    usprintf(&local_f0,"%s: section body size is smaller than DOS header size",
             "parsePeImageSectionBody");
    msg(this,&local_f0,index);
  }
  else {
    Bstrlib::CBString::CBString(&local_f0);
    _Var2._M_p = local_d8.d._M_dataplus._M_p;
    if (*(short *)local_d8.d._M_dataplus._M_p == 0x5a4d) {
      if ((long)(int)(uint)local_d8.d._M_string_length <
          (long)(ulong)*(uint *)(local_d8.d._M_dataplus._M_p + 0x3c)) {
        Bstrlib::CBString::CBString(&local_108,"\nDOS header: invalid");
        Bstrlib::CBString::operator+=(&local_f0,&local_108);
        Bstrlib::CBString::~CBString(&local_108);
        usprintf(&local_108,"%s: PE32 image with invalid DOS header","parsePeImageSectionBody");
        msg(this,&local_108,index);
      }
      else {
        piVar3 = (int *)(local_d8.d._M_dataplus._M_p + *(uint *)(local_d8.d._M_dataplus._M_p + 0x3c)
                        );
        if (*piVar3 == 0x4550) {
          if ((long)(int)(uint)local_d8.d._M_string_length <
              (long)(piVar3 + 1) - (long)local_d8.d._M_dataplus._M_p) {
            Bstrlib::CBString::CBString(&local_108,"\nPE header: invalid");
            Bstrlib::CBString::operator+=(&local_f0,&local_108);
            Bstrlib::CBString::~CBString(&local_108);
            usprintf(&local_108,"%s: PE32 image with invalid PE header","parsePeImageSectionBody");
            msg(this,&local_108,index);
            Bstrlib::CBString::~CBString(&local_108);
            TreeModel::addInfo(this->model,index,&local_f0,true);
          }
          else {
            usprintf(&local_70,"\nDOS signature: %04Xh\nPE signature: %08Xh",0x5a4d,0x4550);
            Bstrlib::CBString::CBString(&local_88,"\nMachine type: ");
            Bstrlib::CBString::operator+(&local_58,&local_70,&local_88);
            machineTypeToUString(&local_a0,*(UINT16 *)(piVar3 + 1));
            Bstrlib::CBString::operator+(&local_40,&local_58,&local_a0);
            usprintf(&local_b8,"\nNumber of sections: %u\nCharacteristics: %04Xh",
                     (ulong)*(ushort *)((long)piVar3 + 6),(ulong)*(ushort *)((long)piVar3 + 0x16));
            Bstrlib::CBString::operator+(&local_108,&local_40,&local_b8);
            Bstrlib::CBString::operator+=(&local_f0,&local_108);
            Bstrlib::CBString::~CBString(&local_108);
            Bstrlib::CBString::~CBString(&local_b8);
            Bstrlib::CBString::~CBString(&local_40);
            Bstrlib::CBString::~CBString(&local_a0);
            Bstrlib::CBString::~CBString(&local_58);
            Bstrlib::CBString::~CBString(&local_88);
            Bstrlib::CBString::~CBString(&local_70);
            if ((long)(int)(uint)local_d8.d._M_string_length < (long)(piVar3 + 6) - (long)_Var2._M_p
               ) {
              Bstrlib::CBString::CBString(&local_108,"\nPE optional header: invalid");
              Bstrlib::CBString::operator+=(&local_f0,&local_108);
              Bstrlib::CBString::~CBString(&local_108);
              usprintf(&local_108,"%s: PE32 image with invalid PE optional header",
                       "parsePeImageSectionBody");
              msg(this,&local_108,index);
            }
            else {
              sVar1 = (short)piVar3[6];
              if (sVar1 == 0x20b) {
                usprintf(&local_108,
                         "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %lXh"
                         ,0x20b,(ulong)*(ushort *)(piVar3 + 0x17),(ulong)(uint)piVar3[10],
                         (ulong)(uint)piVar3[0xb],*(undefined8 *)(piVar3 + 0xc));
                Bstrlib::CBString::operator+=(&local_f0,&local_108);
              }
              else if (sVar1 == 0x10b) {
                usprintf(&local_108,
                         "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %Xh"
                         ,0x10b,(ulong)*(ushort *)(piVar3 + 0x17),(ulong)(uint)piVar3[10],
                         (ulong)(uint)piVar3[0xb],CONCAT44(uVar4,piVar3[0xd]));
                Bstrlib::CBString::operator+=(&local_f0,&local_108);
              }
              else {
                usprintf(&local_108,"\nOptional header signature: %04Xh, unknown");
                Bstrlib::CBString::operator+=(&local_f0,&local_108);
                Bstrlib::CBString::~CBString(&local_108);
                usprintf(&local_108,"%s: PE32 image with invalid optional PE header signature",
                         "parsePeImageSectionBody");
                msg(this,&local_108,index);
              }
            }
            Bstrlib::CBString::~CBString(&local_108);
            TreeModel::addInfo(this->model,index,&local_f0,true);
          }
          goto LAB_00135638;
        }
        usprintf(&local_108,"\nPE signature: %08Xh, invalid");
        Bstrlib::CBString::operator+=(&local_f0,&local_108);
        Bstrlib::CBString::~CBString(&local_108);
        usprintf(&local_108,"%s: PE32 image with invalid PE signature","parsePeImageSectionBody");
        msg(this,&local_108,index);
      }
      Bstrlib::CBString::~CBString(&local_108);
      TreeModel::addInfo(this->model,index,&local_f0,true);
    }
    else {
      usprintf(&local_108,"\nDOS signature: %04Xh, invalid");
      Bstrlib::CBString::operator+=(&local_f0,&local_108);
      Bstrlib::CBString::~CBString(&local_108);
      usprintf(&local_108,"%s: PE32 image with invalid DOS signature","parsePeImageSectionBody");
      msg(this,&local_108,index);
      Bstrlib::CBString::~CBString(&local_108);
      TreeModel::addInfo(this->model,index,&local_f0,true);
    }
  }
LAB_00135638:
  Bstrlib::CBString::~CBString(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.d._M_dataplus._M_p != &local_d8.d.field_2) {
    operator_delete(local_d8.d._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

std::vector<std::pair<std::vector<UString>, UModelIndex> > FfsParser::getFitTable() const
{
    return fitParser->getFitTable();
}